

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls13_server.cc
# Opt level: O3

bool bssl::add_new_session_tickets(SSL_HANDSHAKE *hs,bool *out_sent_tickets)

{
  byte bVar1;
  SSL *ssl;
  _Head_base<0UL,_ssl_session_st_*,_false> this;
  bool bVar2;
  uint16_t value;
  uint32_t uVar3;
  int iVar4;
  uint uVar5;
  size_t sVar6;
  ulong uVar7;
  undefined1 in_R8B;
  Span<const_unsigned_char> nonce_00;
  uint8_t nonce [1];
  UniquePtr<SSL_SESSION> session;
  CBB extensions;
  CBB body;
  CBB ticket;
  CBB early_data;
  CBB nonce_cbb;
  ScopedCBB cbb;
  undefined1 local_169;
  _Head_base<0UL,_ssl_session_st_*,_false> local_168;
  char local_15c [4];
  uint local_158;
  uint local_154;
  CBB local_150;
  CBB local_120;
  CBB local_f0;
  CBB local_c0;
  CBB local_90;
  CBB local_60;
  
  if ((hs->field_0x6c8 & 0x10) != 0) {
    ssl = hs->ssl;
    uVar3 = SSL_get_options(ssl);
    if (((uVar3 >> 0xe & 1) == 0) &&
       ((hs->pake_verifier)._M_t.
        super___uniq_ptr_impl<bssl::spake2plus::Verifier,_bssl::internal::Deleter>._M_t.
        super__Tuple_impl<0UL,_bssl::spake2plus::Verifier_*,_bssl::internal::Deleter>.
        super__Head_base<0UL,_bssl::spake2plus::Verifier_*,_false>._M_head_impl == (Verifier *)0x0))
    {
      ssl_session_rebase_time
                (ssl,(hs->new_session)._M_t.
                     super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                     super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl);
      bVar1 = ((ssl->session_ctx)._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>.
               _M_t.super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl)->num_tickets;
      if (0x10 < bVar1) {
        __assert_fail("ssl->session_ctx->num_tickets <= kMaxTickets",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_server.cc"
                      ,0xaa,"bool bssl::add_new_session_tickets(SSL_HANDSHAKE *, bool *)");
      }
      uVar7 = 0;
      if (bVar1 != 0) {
        local_158 = 0;
        do {
          SSL_SESSION_dup((bssl *)&local_168,
                          (hs->new_session)._M_t.
                          super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                          super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                          super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl,2);
          if ((local_168._M_head_impl == (SSL_SESSION *)0x0) ||
             (iVar4 = RAND_bytes((uchar *)&(local_168._M_head_impl)->ticket_age_add,4), iVar4 == 0))
          {
            std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr
                      ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)&local_168);
            return false;
          }
          (local_168._M_head_impl)->field_0x1b8 = (local_168._M_head_impl)->field_0x1b8 | 8;
          if (((ssl->field_0xa4 & 4) == 0) ||
             (((iVar4 = SSL_is_quic(ssl), iVar4 != 0 &&
               ((((ssl->config)._M_t.
                  super___uniq_ptr_impl<bssl::SSL_CONFIG,_bssl::internal::Deleter>._M_t.
                  super__Tuple_impl<0UL,_bssl::SSL_CONFIG_*,_bssl::internal::Deleter>.
                  super__Head_base<0UL,_bssl::SSL_CONFIG_*,_false>._M_head_impl)->
                quic_early_data_context).size_ == 0)) || (iVar4 = SSL_is_dtls(ssl), iVar4 != 0)))) {
            local_15c[0] = '\0';
            local_15c[1] = '\0';
            local_15c[2] = '\0';
            local_15c[3] = '\0';
          }
          else {
            iVar4 = SSL_is_quic(ssl);
            uVar5 = -(uint)(iVar4 != 0) | 0x3800;
            (local_168._M_head_impl)->ticket_max_early_data = uVar5;
            local_15c = SUB84(CONCAT71((uint7)(uint3)(uVar5 >> 8),1),0);
          }
          (local_168._M_head_impl)->field_0x1b8 =
               (local_168._M_head_impl)->field_0x1b8 & 0x7f | (ssl->field_0xa4 & 8) << 4;
          local_169 = (uint8_t)uVar7;
          CBB_zero(&local_60);
          bVar2 = (*ssl->method->init_message)(ssl,&local_60,&local_120,'\x04');
          local_154 = 1;
          if (((bVar2) &&
              (iVar4 = CBB_add_u32(&local_120,(local_168._M_head_impl)->timeout), iVar4 != 0)) &&
             ((iVar4 = CBB_add_u32(&local_120,(local_168._M_head_impl)->ticket_age_add), iVar4 != 0
              && ((iVar4 = CBB_add_u8_length_prefixed(&local_120,&local_90), iVar4 != 0 &&
                  (iVar4 = CBB_add_bytes(&local_90,&local_169,1),
                  this._M_head_impl = local_168._M_head_impl, iVar4 != 0)))))) {
            iVar4 = SSL_is_dtls(ssl);
            nonce_00.size_ = (ulong)(iVar4 != 0);
            nonce_00.data_ = (uchar *)0x1;
            bVar2 = tls13_derive_session_psk
                              ((bssl *)this._M_head_impl,(SSL_SESSION *)&local_169,nonce_00,
                               (bool)in_R8B);
            if ((bVar2) &&
               ((iVar4 = CBB_add_u16_length_prefixed(&local_120,&local_f0), iVar4 != 0 &&
                (bVar2 = ssl_encrypt_ticket(hs,&local_f0,local_168._M_head_impl), bVar2)))) {
              sVar6 = CBB_len(&local_f0);
              if (sVar6 == 0) {
                local_154 = 4;
              }
              else {
                iVar4 = CBB_add_u16_length_prefixed(&local_120,&local_150);
                if ((iVar4 != 0) &&
                   (((local_15c[0] == '\0' ||
                     ((((iVar4 = CBB_add_u16(&local_150,0x2a), iVar4 != 0 &&
                        (iVar4 = CBB_add_u16_length_prefixed(&local_150,&local_c0), iVar4 != 0)) &&
                       (iVar4 = CBB_add_u32(&local_c0,
                                            (local_168._M_head_impl)->ticket_max_early_data),
                       iVar4 != 0)) && (iVar4 = CBB_flush(&local_150), iVar4 != 0)))) &&
                    (bVar2 = ssl_add_flags_extension
                                       (&local_150,
                                        ((byte)(local_168._M_head_impl)->field_0x1b8 & 0xffffff80) *
                                        2), bVar2)))) {
                  value = ssl_get_grease_value(hs,ssl_grease_ticket_extension);
                  iVar4 = CBB_add_u16(&local_150,value);
                  if ((iVar4 != 0) && (iVar4 = CBB_add_u16(&local_150,0), iVar4 != 0)) {
                    bVar2 = ssl_add_message_cbb(ssl,&local_60);
                    local_154 = (uint)!bVar2;
                    local_158 = local_158 & 0xff;
                    if (bVar2) {
                      local_158 = 1;
                    }
                  }
                }
              }
            }
          }
          CBB_cleanup(&local_60);
          std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr
                    ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)&local_168);
          if ((local_154 & 3) != 0) {
            return false;
          }
          uVar7 = uVar7 + 1;
        } while (uVar7 < ((ssl->session_ctx)._M_t.
                          super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
                          super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
                          super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl)->num_tickets);
        uVar7 = (ulong)((byte)local_158 & 1);
      }
      *out_sent_tickets = SUB81(uVar7,0);
      return true;
    }
  }
  *out_sent_tickets = false;
  return true;
}

Assistant:

static bool add_new_session_tickets(SSL_HANDSHAKE *hs, bool *out_sent_tickets) {
  SSL *const ssl = hs->ssl;
  if (  // If the client doesn't accept resumption with PSK_DHE_KE, don't send a
        // session ticket.
      !hs->accept_psk_mode ||
      // We only implement stateless resumption in TLS 1.3, so skip sending
      // tickets if disabled.
      (SSL_get_options(ssl) & SSL_OP_NO_TICKET) ||
      // Don't send tickets for PAKE connections. We don't support resumption
      // with PAKEs.
      hs->pake_verifier != nullptr) {
    *out_sent_tickets = false;
    return true;
  }

  // Rebase the session timestamp so that it is measured from ticket
  // issuance.
  ssl_session_rebase_time(ssl, hs->new_session.get());

  assert(ssl->session_ctx->num_tickets <= kMaxTickets);
  bool sent_tickets = false;
  for (size_t i = 0; i < ssl->session_ctx->num_tickets; i++) {
    UniquePtr<SSL_SESSION> session(
        SSL_SESSION_dup(hs->new_session.get(), SSL_SESSION_INCLUDE_NONAUTH));
    if (!session) {
      return false;
    }

    if (!RAND_bytes((uint8_t *)&session->ticket_age_add, 4)) {
      return false;
    }
    session->ticket_age_add_valid = true;
    // TODO(crbug.com/381113363): Remove the SSL_is_dtls check once we support
    // 0-RTT for DTLS 1.3.
    bool enable_early_data =
        ssl->enable_early_data &&
        (!SSL_is_quic(ssl) || !ssl->config->quic_early_data_context.empty()) &&
        !SSL_is_dtls(ssl);
    if (enable_early_data) {
      // QUIC does not use the max_early_data_size parameter and always sets it
      // to a fixed value. See RFC 9001, section 4.6.1.
      session->ticket_max_early_data =
          SSL_is_quic(ssl) ? 0xffffffff : kMaxEarlyDataAccepted;
    }
    session->is_resumable_across_names = ssl->resumption_across_names_enabled;

    static_assert(kMaxTickets < 256, "Too many tickets");
    assert(i < 256);
    uint8_t nonce[] = {static_cast<uint8_t>(i)};

    ScopedCBB cbb;
    CBB body, nonce_cbb, ticket, extensions;
    if (!ssl->method->init_message(ssl, cbb.get(), &body,
                                   SSL3_MT_NEW_SESSION_TICKET) ||
        !CBB_add_u32(&body, session->timeout) ||
        !CBB_add_u32(&body, session->ticket_age_add) ||
        !CBB_add_u8_length_prefixed(&body, &nonce_cbb) ||
        !CBB_add_bytes(&nonce_cbb, nonce, sizeof(nonce)) ||
        !tls13_derive_session_psk(session.get(), nonce, SSL_is_dtls(ssl)) ||
        !CBB_add_u16_length_prefixed(&body, &ticket) ||
        !ssl_encrypt_ticket(hs, &ticket, session.get())) {
      return false;
    }

    if (CBB_len(&ticket) == 0) {
      // The caller decided not to encrypt a ticket. Skip the message.
      continue;
    }

    if (!CBB_add_u16_length_prefixed(&body, &extensions)) {
      return false;
    }

    if (enable_early_data) {
      CBB early_data;
      if (!CBB_add_u16(&extensions, TLSEXT_TYPE_early_data) ||
          !CBB_add_u16_length_prefixed(&extensions, &early_data) ||
          !CBB_add_u32(&early_data, session->ticket_max_early_data) ||
          !CBB_flush(&extensions)) {
        return false;
      }
    }

    SSLFlags flags = 0;
    if (session->is_resumable_across_names) {
      flags |= kSSLFlagResumptionAcrossNames;
    }
    if (!ssl_add_flags_extension(&extensions, flags)) {
      return false;
    }

    // Add a fake extension. See RFC 8701.
    if (!CBB_add_u16(&extensions,
                     ssl_get_grease_value(hs, ssl_grease_ticket_extension)) ||
        !CBB_add_u16(&extensions, 0 /* empty */)) {
      return false;
    }

    if (!ssl_add_message_cbb(ssl, cbb.get())) {
      return false;
    }
    sent_tickets = true;
  }

  *out_sent_tickets = sent_tickets;
  return true;
}